

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O1

char * rtosc::helpers::get_value_from_runtime
                 (void *runtime,Ports *ports,size_t loc_size,char *loc,char *buffer_with_port,
                 size_t buffersize,int cols_used)

{
  char *pcVar1;
  size_t sVar2;
  CapturePretty d;
  RtData local_c0;
  char *local_48;
  long local_40;
  int local_38;
  
  sVar2 = strlen(buffer_with_port);
  RtData::RtData(&local_c0);
  local_c0._vptr_RtData = (_func_int **)&PTR__RtData_00120c68;
  local_38 = cols_used;
  local_c0.matches = 0;
  pcVar1 = buffer_with_port + sVar2;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  buffer_with_port[(sVar2 & 0xfffffffffffffffc) + 4] = ',';
  local_c0.loc = loc;
  local_c0.loc_size = loc_size;
  local_c0.obj = runtime;
  local_c0.message = buffer_with_port;
  local_48 = buffer_with_port + sVar2;
  local_40 = buffersize - sVar2;
  Ports::dispatch(ports,buffer_with_port,&local_c0,false);
  return local_48;
}

Assistant:

const char* get_value_from_runtime(void* runtime, const Ports& ports,
                                   size_t loc_size, char* loc,
                                   char* buffer_with_port,
                                   std::size_t buffersize,
                                   int cols_used)
{
    std::size_t addr_len = strlen(buffer_with_port);

    // use the port buffer to print the result, but do not overwrite the
    // port name
    CapturePretty d(buffer_with_port + addr_len, buffersize - addr_len,
                    cols_used);
    d.obj = runtime;
    d.loc_size = loc_size;
    d.loc = loc;
    d.matches = 0;

    // does the message at least fit the arguments?
    assert(buffersize - addr_len >= 8);
    // append type
    memset(buffer_with_port + addr_len, 0, 8); // cover string end and arguments
    buffer_with_port[addr_len + (4-addr_len%4)] = ',';

    d.message = buffer_with_port;

    // buffer_with_port is a message in this call:
    ports.dispatch(buffer_with_port, d, false);

    return d.value();
}